

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Vec_Ptr_t * createMonotoneBarrierLO(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  if ((vBarriers == (Vec_Ptr_t *)0x0) || (uVar6 = vBarriers->nSize, (int)uVar6 < 1)) {
    pVVar3 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    uVar7 = 8;
    if (8 < uVar6) {
      uVar7 = (ulong)uVar6;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = (int)uVar7;
    ppvVar4 = (void **)malloc(uVar7 << 3);
    pVVar3->pArray = ppvVar4;
    do {
      pAVar5 = Aig_ObjCreateCi(pAigNew);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_0062ceec;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar8;
      }
LAB_0062ceec:
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = pAVar5;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t *createMonotoneBarrierLO( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers )
{
    Vec_Ptr_t *vMonotoneLO;
    int barrierCount;
    Aig_Obj_t *pObj;
    int i;

    if( vBarriers == NULL )
        return NULL;

    barrierCount = Vec_PtrSize(vBarriers);
    if( barrierCount <= 0 )
        return NULL;

    vMonotoneLO = Vec_PtrAlloc(barrierCount);    
    for( i=0; i<barrierCount; i++ )
    {
        pObj = Aig_ObjCreateCi( pAigNew );
        Vec_PtrPush( vMonotoneLO, pObj );
    }

    return vMonotoneLO;
}